

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O2

MppBufferGroup dec_buf_mgr_setup(DecBufMgr mgr,RK_U32 size,RK_U32 count,MppDecBufMode mode)

{
  long *plVar1;
  long lVar2;
  MppDecBufMode MVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  int iVar7;
  RK_U32 i;
  ulong uVar8;
  MppBufferInfo commit;
  
  if (mgr == (DecBufMgr)0x0) {
    return (MppBufferGroup)0x0;
  }
  plVar1 = (long *)((long)mgr + 0x10);
  if (*(long *)((long)mgr + 0x10) != 0) {
    if (*mgr == mode) {
      mpp_buffer_group_clear();
    }
    else {
      mpp_buffer_group_put();
      *plVar1 = 0;
    }
    if (*(long *)((long)mgr + 0x18) != 0) {
      for (uVar8 = 0; uVar8 < *(uint *)((long)mgr + 4); uVar8 = uVar8 + 1) {
        lVar5 = *(long *)(*(long *)((long)mgr + 0x18) + uVar8 * 8);
        if (lVar5 != 0) {
          mpp_buffer_put_with_caller(lVar5,"dec_buf_mgr_setup");
          *(undefined8 *)(*(long *)((long)mgr + 0x18) + uVar8 * 8) = 0;
        }
      }
      if (*(long *)((long)mgr + 0x18) != 0) {
        mpp_osal_free("dec_buf_mgr_setup");
      }
      *(undefined8 *)((long)mgr + 0x18) = 0;
    }
  }
  if (mode == MPP_DEC_BUF_EXTERNAL) {
    lVar5 = mpp_osal_calloc("dec_buf_mgr_setup");
    *(long *)((long)mgr + 0x18) = lVar5;
    if (lVar5 == 0) {
      pcVar6 = "create %d external buffer record failed\n";
      MVar3 = count;
    }
    else {
      if (*plVar1 == 0) {
        MVar3 = mpp_buffer_group_get(plVar1,1,1,"mpi_dec_utils","dec_buf_mgr_setup");
        if (MVar3 != MPP_DEC_BUF_HALF_INT) {
          pcVar6 = "get mpp external buffer group failed ret %d\n";
          goto LAB_0010b89f;
        }
        iVar4 = 0;
      }
      else {
        iVar4 = -1;
      }
      commit.type = MPP_BUFFER_TYPE_ION;
      iVar7 = 0;
      lVar5 = 0;
      commit.size = (ulong)size;
      do {
        if ((ulong)count << 3 == lVar5) {
LAB_0010b851:
          if (iVar4 == 0) goto LAB_0010b69e;
          goto LAB_0010b8a6;
        }
        iVar4 = mpp_buffer_get_with_tag
                          (0,*(long *)((long)mgr + 0x18) + lVar5,(ulong)size,"mpi_dec_utils",
                           "dec_buf_mgr_setup");
        if ((iVar4 != 0) || (lVar2 = *(long *)(*(long *)((long)mgr + 0x18) + lVar5), lVar2 == 0)) {
          _mpp_log_l(2,"mpi_dec_utils","get misc buffer failed ret %d\n","dec_buf_mgr_setup",iVar4);
          goto LAB_0010b851;
        }
        commit.index = iVar7;
        commit.ptr = (void *)mpp_buffer_get_ptr_with_caller(lVar2,"dec_buf_mgr_setup");
        commit.fd = mpp_buffer_get_fd_with_caller
                              (*(undefined8 *)(*(long *)((long)mgr + 0x18) + lVar5),
                               "dec_buf_mgr_setup");
        iVar4 = 0;
        MVar3 = mpp_buffer_import_with_tag
                          (*(undefined8 *)((long)mgr + 0x10),&commit,0,"mpi_dec_utils",
                           "dec_buf_mgr_setup");
        lVar5 = lVar5 + 8;
        iVar7 = iVar7 + 1;
      } while (MVar3 == MPP_DEC_BUF_HALF_INT);
      pcVar6 = "external buffer commit failed ret %d\n";
    }
  }
  else {
    if (mode == MPP_DEC_BUF_INTERNAL) {
      if ((*plVar1 != 0) &&
         (_mpp_log_l(2,"mpi_dec_utils","Assertion %s failed at %s:%d\n",0,
                     "((void*)0) == impl->group","dec_buf_mgr_setup",0x365),
         (DAT_00118343 & 0x10) != 0)) {
        abort();
      }
LAB_0010b69e:
      *(RK_U32 *)((long)mgr + 4) = count;
      *(RK_U32 *)((long)mgr + 8) = size;
      *(MppDecBufMode *)mgr = mode;
      return *(MppBufferGroup *)((long)mgr + 0x10);
    }
    if (mode == MPP_DEC_BUF_HALF_INT) {
      lVar5 = *plVar1;
      if (lVar5 == 0) {
        MVar3 = mpp_buffer_group_get(plVar1,1,0,"mpi_dec_utils","dec_buf_mgr_setup");
        if (MVar3 != MPP_DEC_BUF_HALF_INT) {
          pcVar6 = "get mpp internal buffer group failed ret %d\n";
          goto LAB_0010b89f;
        }
        lVar5 = *plVar1;
      }
      MVar3 = mpp_buffer_group_limit_config(lVar5,size,count);
      if (MVar3 == MPP_DEC_BUF_HALF_INT) goto LAB_0010b69e;
      pcVar6 = "limit buffer group failed ret %d\n";
    }
    else {
      pcVar6 = "unsupport buffer mode %d\n";
      MVar3 = mode;
    }
  }
LAB_0010b89f:
  _mpp_log_l(2,"mpi_dec_utils",pcVar6,"dec_buf_mgr_setup",MVar3);
LAB_0010b8a6:
  dec_buf_mgr_deinit(mgr);
  return (MppBufferGroup)0x0;
}

Assistant:

MppBufferGroup dec_buf_mgr_setup(DecBufMgr mgr, RK_U32 size, RK_U32 count, MppDecBufMode mode)
{
    DecBufMgrImpl *impl = (DecBufMgrImpl *)mgr;
    MPP_RET ret = MPP_NOK;

    if (!impl)
        return NULL;

    /* cleanup old buffers if previous buffer group exists */
    if (impl->group) {
        if (mode != impl->buf_mode) {
            /* switch to different buffer mode just release old buffer group */
            mpp_buffer_group_put(impl->group);
            impl->group = NULL;
        } else {
            /* otherwise just cleanup old buffers */
            mpp_buffer_group_clear(impl->group);
        }

        /* if there are external mode old buffers do cleanup */
        if (impl->bufs) {
            RK_U32 i;

            for (i = 0; i < impl->buf_count; i++) {
                if (impl->bufs[i]) {
                    mpp_buffer_put(impl->bufs[i]);
                    impl->bufs[i] = NULL;
                }
            }

            MPP_FREE(impl->bufs);
        }
    }

    switch (mode) {
    case MPP_DEC_BUF_HALF_INT : {
        /* reuse previous half internal buffer group and just reconfig limit */
        if (NULL == impl->group) {
            ret = mpp_buffer_group_get_internal(&impl->group, MPP_BUFFER_TYPE_ION);
            if (ret) {
                mpp_err_f("get mpp internal buffer group failed ret %d\n", ret);
                break;
            }
        }
        /* Use limit config to limit buffer count and buffer size */
        ret = mpp_buffer_group_limit_config(impl->group, size, count);
        if (ret) {
            mpp_err_f("limit buffer group failed ret %d\n", ret);
        }
    } break;
    case MPP_DEC_BUF_INTERNAL : {
        /* do nothing juse keep buffer group empty */
        mpp_assert(NULL == impl->group);
        ret = MPP_OK;
    } break;
    case MPP_DEC_BUF_EXTERNAL : {
        RK_U32 i;
        MppBufferInfo commit;

        impl->bufs = mpp_calloc(MppBuffer, count);
        if (!impl->bufs) {
            mpp_err_f("create %d external buffer record failed\n", count);
            break;
        }

        /* reuse previous external buffer group */
        if (NULL == impl->group) {
            ret = mpp_buffer_group_get_external(&impl->group, MPP_BUFFER_TYPE_ION);
            if (ret) {
                mpp_err_f("get mpp external buffer group failed ret %d\n", ret);
                break;
            }
        }

        /*
         * NOTE: Use default misc allocater here as external allocator for demo.
         * But in practical case the external buffer could be GraphicBuffer or gst dmabuf.
         * The misc allocator will cause the print at the end like:
         * ~MppBufferService cleaning misc group
         */
        commit.type = MPP_BUFFER_TYPE_ION;
        commit.size = size;

        for (i = 0; i < count; i++) {
            ret = mpp_buffer_get(NULL, &impl->bufs[i], size);
            if (ret || NULL == impl->bufs[i]) {
                mpp_err_f("get misc buffer failed ret %d\n", ret);
                break;
            }

            commit.index = i;
            commit.ptr = mpp_buffer_get_ptr(impl->bufs[i]);
            commit.fd = mpp_buffer_get_fd(impl->bufs[i]);

            ret = mpp_buffer_commit(impl->group, &commit);
            if (ret) {
                mpp_err_f("external buffer commit failed ret %d\n", ret);
                break;
            }
        }
    } break;
    default : {
        mpp_err_f("unsupport buffer mode %d\n", mode);
    } break;
    }

    if (ret) {
        dec_buf_mgr_deinit(impl);
        impl = NULL;
    } else {
        impl->buf_count = count;
        impl->buf_size = size;
        impl->buf_mode = mode;
    }

    return impl ? impl->group : NULL;
}